

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int vtabCallConstructor(sqlite3 *db,Table *pTab,Module *pMod,
                       _func_int_sqlite3_ptr_void_ptr_int_char_ptr_ptr_sqlite3_vtab_ptr_ptr_char_ptr_ptr
                       *xConstruct,char **pzErr)

{
  u32 *puVar1;
  int iVar2;
  char **ppcVar3;
  Schema *pSVar4;
  sqlite3_vtab *psVar5;
  ushort uVar6;
  int iVar7;
  VtabCtx *pVVar8;
  VTable *pVTab;
  char *pcVar9;
  char *pcVar10;
  size_t sVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  Schema **ppSVar15;
  char *pcVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  long in_FS_OFFSET;
  char *zErr;
  Column *local_80;
  short local_78;
  char *local_60;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  iVar2 = (pTab->u).tab.addColOffset;
  local_60 = (char *)0x0;
  ppcVar3 = (pTab->u).vtab.azArg;
  for (pVVar8 = db->pVtabCtx; pVVar8 != (VtabCtx *)0x0; pVVar8 = pVVar8->pPrior) {
    if (pVVar8->pTab == pTab) {
      pcVar9 = sqlite3MPrintf(db,"vtable constructor called recursively: %s",pTab->zName);
      *pzErr = pcVar9;
      iVar7 = 6;
      goto LAB_0015da36;
    }
  }
  pcVar9 = sqlite3DbStrDup(db,pTab->zName);
  iVar7 = 7;
  if (pcVar9 == (char *)0x0) goto LAB_0015da36;
  pVTab = (VTable *)sqlite3Malloc(0x30);
  if (pVTab == (VTable *)0x0) {
    sqlite3OomFault(db);
    iVar7 = 7;
  }
  else {
    pVTab->db = (sqlite3 *)0x0;
    pVTab->pMod = (Module *)0x0;
    pVTab->pVtab = (sqlite3_vtab *)0x0;
    pVTab->nRef = 0;
    pVTab->bConstraint = '\0';
    pVTab->bAllSchemas = '\0';
    pVTab->eVtabRisk = '\0';
    pVTab->field_0x1f = 0;
    *(undefined8 *)&pVTab->iSavepoint = 0;
    pVTab->pNext = (VTable *)0x0;
    pVTab->db = db;
    pVTab->pMod = pMod;
    pVTab->eVtabRisk = '\x01';
    if (pTab->pSchema == (Schema *)0x0) {
      lVar19 = -0x8000;
    }
    else {
      lVar19 = -0x100000000;
      ppSVar15 = &db->aDb->pSchema;
      do {
        lVar19 = lVar19 + 0x100000000;
        pSVar4 = *ppSVar15;
        ppSVar15 = ppSVar15 + 4;
      } while (pSVar4 != pTab->pSchema);
      lVar19 = lVar19 >> 0x20;
    }
    ((pTab->u).tab.pFKey)->pNextFrom = (FKey *)db->aDb[lVar19].zDbSName;
    local_58._16_8_ = db->pVtabCtx;
    local_58._24_8_ = local_58._24_8_ & 0xffffffff00000000;
    db->pVtabCtx = (VtabCtx *)local_58;
    pTab->nTabRef = pTab->nTabRef + 1;
    local_58._0_8_ = pVTab;
    local_58._8_8_ = pTab;
    iVar7 = (*xConstruct)(db,pMod->pAux,iVar2,ppcVar3,&pVTab->pVtab,&local_60);
    if (db->pnBytesFreed == (int *)0x0) {
      puVar1 = &pTab->nTabRef;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) goto LAB_0015d7fb;
    }
    else {
LAB_0015d7fb:
      deleteTable(db,pTab);
    }
    db->pVtabCtx = (VtabCtx *)local_58._16_8_;
    if (iVar7 == 0) {
      psVar5 = pVTab->pVtab;
      iVar7 = 0;
      if (psVar5 != (sqlite3_vtab *)0x0) {
        psVar5->pModule = (sqlite3_module *)0x0;
        *(undefined8 *)&psVar5->nRef = 0;
        psVar5->zErrMsg = (char *)0x0;
        pVTab->pVtab->pModule = pMod->pModule;
        pMod->nRefModule = pMod->nRefModule + 1;
        pVTab->nRef = 1;
        if (local_58._24_4_ == 0) {
          pcVar10 = sqlite3MPrintf(db,"vtable constructor did not declare schema: %s",pcVar9);
          *pzErr = pcVar10;
          sqlite3VtabUnlock(pVTab);
          iVar7 = 1;
        }
        else {
          pVTab->pNext = (VTable *)(pTab->u).tab.pDfltList;
          (pTab->u).vtab.p = pVTab;
          local_78 = pTab->nCol;
          if (0 < local_78) {
            local_80 = pTab->aCol;
            lVar19 = 0;
            uVar6 = 0;
            do {
              pcVar10 = sqlite3ColumnType(local_80 + lVar19,"");
              if (pcVar10 != (char *)0x0) {
                sVar11 = strlen(pcVar10);
                if ((sVar11 & 0x3fffffff) != 0) {
                  uVar12 = (ulong)((uint)sVar11 & 0x3fffffff);
                  uVar13 = 0;
                  pcVar16 = pcVar10;
LAB_0015d92c:
                  if (pcVar10 == (char *)0x0) goto LAB_0015d969;
                  lVar17 = 0;
                  do {
                    if (""[(byte)"hidden"[lVar17]] != ""[(byte)pcVar16[lVar17]]) goto LAB_0015d969;
                    lVar17 = lVar17 + 1;
                  } while (lVar17 != 6);
                  if (((uVar13 != 0) && (pcVar10[uVar13 - 1] != ' ')) ||
                     ((pcVar10[uVar13 + 6] & 0xdfU) != 0)) goto LAB_0015d969;
                  uVar14 = 7 - (pcVar10[uVar13 + 6] == 0);
                  uVar18 = uVar13;
                  if (uVar14 + (int)uVar13 <= ((uint)sVar11 & 0x3fffffff)) {
                    do {
                      pcVar10[uVar18] = pcVar10[uVar18 + uVar14];
                      lVar17 = uVar14 + uVar18;
                      uVar18 = uVar18 + 1;
                    } while (lVar17 + 1U <= uVar12);
                  }
                  if ((uVar13 != 0) && (pcVar10[uVar13] == '\0')) {
                    pcVar10[uVar13 - 1] = '\0';
                  }
                  local_80 = pTab->aCol;
                  local_80[lVar19].colFlags = local_80[lVar19].colFlags | 2;
                  *(byte *)&pTab->tabFlags = (byte)pTab->tabFlags | 2;
                  local_78 = pTab->nCol;
                  uVar6 = 0x400;
                  goto LAB_0015d97c;
                }
              }
LAB_0015d974:
              pTab->tabFlags = pTab->tabFlags | (uint)uVar6;
LAB_0015d97c:
              lVar19 = lVar19 + 1;
            } while (lVar19 < local_78);
            iVar7 = 0;
          }
        }
      }
    }
    else {
      if (iVar7 == 7) {
        sqlite3OomFault(db);
      }
      if (local_60 == (char *)0x0) {
        pcVar10 = sqlite3MPrintf(db,"vtable constructor failed: %s",pcVar9);
        *pzErr = pcVar10;
      }
      else {
        pcVar10 = sqlite3MPrintf(db,"%s");
        *pzErr = pcVar10;
        sqlite3_free(local_60);
      }
      sqlite3DbFreeNN(db,pVTab);
    }
  }
  sqlite3DbFreeNN(db,pcVar9);
LAB_0015da36:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar7;
  }
  __stack_chk_fail();
LAB_0015d969:
  uVar13 = uVar13 + 1;
  pcVar16 = pcVar16 + 1;
  if (uVar13 == uVar12) goto LAB_0015d974;
  goto LAB_0015d92c;
}

Assistant:

static int vtabCallConstructor(
  sqlite3 *db,
  Table *pTab,
  Module *pMod,
  int (*xConstruct)(sqlite3*,void*,int,const char*const*,sqlite3_vtab**,char**),
  char **pzErr
){
  VtabCtx sCtx;
  VTable *pVTable;
  int rc;
  const char *const*azArg;
  int nArg = pTab->u.vtab.nArg;
  char *zErr = 0;
  char *zModuleName;
  int iDb;
  VtabCtx *pCtx;

  assert( IsVirtual(pTab) );
  azArg = (const char *const*)pTab->u.vtab.azArg;

  /* Check that the virtual-table is not already being initialized */
  for(pCtx=db->pVtabCtx; pCtx; pCtx=pCtx->pPrior){
    if( pCtx->pTab==pTab ){
      *pzErr = sqlite3MPrintf(db,
          "vtable constructor called recursively: %s", pTab->zName
      );
      return SQLITE_LOCKED;
    }
  }

  zModuleName = sqlite3DbStrDup(db, pTab->zName);
  if( !zModuleName ){
    return SQLITE_NOMEM_BKPT;
  }

  pVTable = sqlite3MallocZero(sizeof(VTable));
  if( !pVTable ){
    sqlite3OomFault(db);
    sqlite3DbFree(db, zModuleName);
    return SQLITE_NOMEM_BKPT;
  }
  pVTable->db = db;
  pVTable->pMod = pMod;
  pVTable->eVtabRisk = SQLITE_VTABRISK_Normal;

  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  pTab->u.vtab.azArg[1] = db->aDb[iDb].zDbSName;

  /* Invoke the virtual table constructor */
  assert( &db->pVtabCtx );
  assert( xConstruct );
  sCtx.pTab = pTab;
  sCtx.pVTable = pVTable;
  sCtx.pPrior = db->pVtabCtx;
  sCtx.bDeclared = 0;
  db->pVtabCtx = &sCtx;
  pTab->nTabRef++;
  rc = xConstruct(db, pMod->pAux, nArg, azArg, &pVTable->pVtab, &zErr);
  assert( pTab!=0 );
  assert( pTab->nTabRef>1 || rc!=SQLITE_OK );
  sqlite3DeleteTable(db, pTab);
  db->pVtabCtx = sCtx.pPrior;
  if( rc==SQLITE_NOMEM ) sqlite3OomFault(db);
  assert( sCtx.pTab==pTab );

  if( SQLITE_OK!=rc ){
    if( zErr==0 ){
      *pzErr = sqlite3MPrintf(db, "vtable constructor failed: %s", zModuleName);
    }else {
      *pzErr = sqlite3MPrintf(db, "%s", zErr);
      sqlite3_free(zErr);
    }
    sqlite3DbFree(db, pVTable);
  }else if( ALWAYS(pVTable->pVtab) ){
    /* Justification of ALWAYS():  A correct vtab constructor must allocate
    ** the sqlite3_vtab object if successful.  */
    memset(pVTable->pVtab, 0, sizeof(pVTable->pVtab[0]));
    pVTable->pVtab->pModule = pMod->pModule;
    pMod->nRefModule++;
    pVTable->nRef = 1;
    if( sCtx.bDeclared==0 ){
      const char *zFormat = "vtable constructor did not declare schema: %s";
      *pzErr = sqlite3MPrintf(db, zFormat, zModuleName);
      sqlite3VtabUnlock(pVTable);
      rc = SQLITE_ERROR;
    }else{
      int iCol;
      u16 oooHidden = 0;
      /* If everything went according to plan, link the new VTable structure
      ** into the linked list headed by pTab->u.vtab.p. Then loop through the
      ** columns of the table to see if any of them contain the token "hidden".
      ** If so, set the Column COLFLAG_HIDDEN flag and remove the token from
      ** the type string.  */
      pVTable->pNext = pTab->u.vtab.p;
      pTab->u.vtab.p = pVTable;

      for(iCol=0; iCol<pTab->nCol; iCol++){
        char *zType = sqlite3ColumnType(&pTab->aCol[iCol], "");
        int nType;
        int i = 0;
        nType = sqlite3Strlen30(zType);
        for(i=0; i<nType; i++){
          if( 0==sqlite3StrNICmp("hidden", &zType[i], 6)
           && (i==0 || zType[i-1]==' ')
           && (zType[i+6]=='\0' || zType[i+6]==' ')
          ){
            break;
          }
        }
        if( i<nType ){
          int j;
          int nDel = 6 + (zType[i+6] ? 1 : 0);
          for(j=i; (j+nDel)<=nType; j++){
            zType[j] = zType[j+nDel];
          }
          if( zType[i]=='\0' && i>0 ){
            assert(zType[i-1]==' ');
            zType[i-1] = '\0';
          }
          pTab->aCol[iCol].colFlags |= COLFLAG_HIDDEN;
          pTab->tabFlags |= TF_HasHidden;
          oooHidden = TF_OOOHidden;
        }else{
          pTab->tabFlags |= oooHidden;
        }
      }
    }
  }

  sqlite3DbFree(db, zModuleName);
  return rc;
}